

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDebugMarkerTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_0::InvalidCase::iterate(InvalidCase *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  MessageBuilder local_1a0;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "Note: GL_EXT_debug_marker calls must not report an error even if invalid arguments are supplied."
                 );
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  (**(code **)(lVar2 + 0x1208))(0xffffffff,"foo");
  (**(code **)(lVar2 + 0xc20))(0xffffffff,"foo");
  (**(code **)(lVar2 + 0x1208))(0,0);
  (**(code **)(lVar2 + 0xc20))(0,0);
  (**(code **)(lVar2 + 0x1208))(0xffffffff,0);
  (**(code **)(lVar2 + 0xc20))(0xffffffff,0);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"Debug marker calls must not set error state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDebugMarkerTests.cpp"
                  ,0xbb);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "All calls passed");
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();

		m_testCtx.getLog() << TestLog::Message << "Note: GL_EXT_debug_marker calls must not report an error even if invalid arguments are supplied." << TestLog::EndMessage;

		gl.pushGroupMarkerEXT(-1, "foo");
		gl.insertEventMarkerEXT(-1, "foo");
		gl.pushGroupMarkerEXT(0, DE_NULL);
		gl.insertEventMarkerEXT(0, DE_NULL);
		gl.pushGroupMarkerEXT(-1, DE_NULL);
		gl.insertEventMarkerEXT(-1, DE_NULL);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Debug marker calls must not set error state");

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "All calls passed");
		return STOP;
	}